

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.c
# Opt level: O2

void logfopen_callback(void *vctx,int mode)

{
  uint uVar1;
  bufchain *ch;
  _Bool _Var2;
  FILE *pFVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  ptrlen data;
  tm local_160;
  char buf [256];
  
  bVar8 = mode != 0;
  if (bVar8) {
    pcVar6 = "wb";
    if (mode == 1) {
      pcVar6 = "ab";
    }
    pFVar3 = f_open(*(Filename **)((long)vctx + 0x38),pcVar6,false);
    *(FILE **)vctx = pFVar3;
    if (pFVar3 != (FILE *)0x0) {
      *(undefined4 *)((long)vctx + 8) = 2;
      _Var2 = conf_get_bool(*(Conf **)((long)vctx + 0x48),0x85);
      if (_Var2) {
        ltime();
        strftime(buf,0x18,"%Y.%m.%d %H:%M:%S",&local_160);
        bVar8 = false;
        logprintf((LogContext *)vctx,
                  "=~=~=~=~=~=~=~=~=~=~=~= PuTTY log %s =~=~=~=~=~=~=~=~=~=~=~=\r\n",buf);
      }
      else {
        bVar8 = false;
      }
      goto LAB_0011ca90;
    }
  }
  *(undefined4 *)((long)vctx + 8) = 3;
LAB_0011ca90:
  pcVar6 = "Disabled writing";
  if (mode != 0) {
    pcVar6 = "Error writing";
  }
  pcVar7 = "Writing new";
  if (mode == 1) {
    pcVar7 = "Appending";
  }
  if (*(int *)((long)vctx + 8) == 3) {
    pcVar7 = pcVar6;
  }
  uVar1 = *(int *)((long)vctx + 0x50) - 1;
  if (uVar1 < 3) {
    pcVar6 = &DAT_001405f4 + *(int *)(&DAT_001405f4 + (ulong)uVar1 * 4);
  }
  else {
    pcVar6 = "unknown";
    if (*(int *)((long)vctx + 0x50) == 4) {
      pcVar6 = "SSH raw data";
    }
  }
  pcVar4 = filename_to_str(*(Filename **)((long)vctx + 0x38));
  pcVar6 = dupprintf("%s session log (%s mode) to file: %s",pcVar7,pcVar6,pcVar4);
  (**(code **)**(undefined8 **)((long)vctx + 0x40))(*(undefined8 **)((long)vctx + 0x40),pcVar6);
  if (bVar8) {
    (**(code **)(**(long **)((long)vctx + 0x40) + 0x10))(*(long **)((long)vctx + 0x40),pcVar6);
  }
  safefree(pcVar6);
  if (*(int *)((long)vctx + 8) != 1) {
    ch = (bufchain *)((long)vctx + 0x10);
    while( true ) {
      sVar5 = bufchain_size(ch);
      if (sVar5 == 0) break;
      data = bufchain_prefix(ch);
      logwrite((LogContext *)vctx,data);
      bufchain_consume(ch,data.len);
    }
    logflush((LogContext *)vctx);
    return;
  }
  __assert_fail("ctx->state != L_OPENING",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/logging.c",0x8f,
                "void logfopen_callback(void *, int)");
}

Assistant:

static void logfopen_callback(void *vctx, int mode)
{
    LogContext *ctx = (LogContext *)vctx;
    char buf[256], *event;
    struct tm tm;
    const char *fmode;
    bool shout = false;

    if (mode == 0) {
        ctx->state = L_ERROR;          /* disable logging */
    } else {
        fmode = (mode == 1 ? "ab" : "wb");
        ctx->lgfp = f_open(ctx->currlogfilename, fmode, false);
        if (ctx->lgfp) {
            ctx->state = L_OPEN;
        } else {
            ctx->state = L_ERROR;
            shout = true;
        }
    }

    if (ctx->state == L_OPEN && conf_get_bool(ctx->conf, CONF_logheader)) {
        /* Write header line into log file. */
        tm = ltime();
        strftime(buf, 24, "%Y.%m.%d %H:%M:%S", &tm);
        logprintf(ctx, "=~=~=~=~=~=~=~=~=~=~=~= PuTTY log %s"
                  " =~=~=~=~=~=~=~=~=~=~=~=\r\n", buf);
    }

    event = dupprintf("%s session log (%s mode) to file: %s",
                      ctx->state == L_ERROR ?
                      (mode == 0 ? "Disabled writing" : "Error writing") :
                      (mode == 1 ? "Appending" : "Writing new"),
                      (ctx->logtype == LGTYP_ASCII ? "ASCII" :
                       ctx->logtype == LGTYP_DEBUG ? "raw" :
                       ctx->logtype == LGTYP_PACKETS ? "SSH packets" :
                       ctx->logtype == LGTYP_SSHRAW ? "SSH raw data" :
                       "unknown"),
                      filename_to_str(ctx->currlogfilename));
    lp_eventlog(ctx->lp, event);
    if (shout) {
        /*
         * If we failed to open the log file due to filesystem error
         * (as opposed to user action such as clicking Cancel in the
         * askappend box), we should log it more prominently.
         */
        lp_logging_error(ctx->lp, event);
    }
    sfree(event);

    /*
     * Having either succeeded or failed in opening the log file,
     * we should write any queued data out.
     */
    assert(ctx->state != L_OPENING);   /* make _sure_ it won't be requeued */
    while (bufchain_size(&ctx->queue)) {
        ptrlen data = bufchain_prefix(&ctx->queue);
        logwrite(ctx, data);
        bufchain_consume(&ctx->queue, data.len);
    }
    logflush(ctx);
}